

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  bool bVar1;
  cmMakefile *mf;
  size_t sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  reference pcVar5;
  cmPropertyMap *this_00;
  WrapQuotes in_R8D;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar6;
  undefined1 auVar7 [16];
  string_view str;
  string local_218;
  reference local_1f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  int local_19c;
  string local_198;
  int local_178;
  char local_171;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_170;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_130;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_120;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  int local_f4;
  string local_f0;
  int local_cc;
  undefined1 local_c8 [8];
  string exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command;
  string local_98;
  string local_78 [8];
  string equalSigns;
  string local_48;
  byte local_21;
  ostream *poStack_20;
  bool quote_test_name;
  ostream *fout_local;
  cmTestGenerator *this_local;
  Indent indent_local;
  
  this->TestGenerated = true;
  poStack_20 = fout;
  fout_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  mf = cmTest::GetMakefile(this->Test);
  cmTest::GetName_abi_cxx11_(&local_48,this->Test);
  bVar1 = anon_unknown.dwarf_2e5d4d::needToQuoteTestName(mf,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_21 = bVar1;
  cmTest::GetName_abi_cxx11_(&local_98,this->Test);
  sVar2 = anon_unknown.dwarf_2e5d4d::countMaxConsecutiveEqualSigns(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,sVar2 + 1,'=',(allocator<char> *)((long)&command + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&command + 7));
  std::__cxx11::string::~string((string *)&local_98);
  exe.field_2._8_8_ = cmTest::GetCommand_abi_cxx11_(this->Test);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)exe.field_2._8_8_,0);
  std::__cxx11::string::string((string *)local_c8,(string *)pvVar3);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_c8);
  if ((local_21 & 1) == 0) {
    local_f4 = this_local._4_4_;
    poVar4 = ::operator<<(poStack_20,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar4 = std::operator<<(poVar4,"add_test(");
    cmTest::GetName_abi_cxx11_((string *)&__range1,this->Test);
    poVar4 = std::operator<<(poVar4,(string *)&__range1);
    poVar4 = std::operator<<(poVar4," \"");
    poVar4 = std::operator<<(poVar4,(string *)local_c8);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string((string *)&__range1);
  }
  else {
    local_cc = this_local._4_4_;
    poVar4 = ::operator<<(poStack_20,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar4 = std::operator<<(poVar4,"add_test([");
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::operator<<(poVar4,"[");
    cmTest::GetName_abi_cxx11_(&local_f0,this->Test);
    poVar4 = std::operator<<(poVar4,(string *)&local_f0);
    poVar4 = std::operator<<(poVar4,"]");
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::operator<<(poVar4,"] \"");
    poVar4 = std::operator<<(poVar4,(string *)local_c8);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string((string *)&local_f0);
  }
  cVar6 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)exe.field_2._8_8_);
  __begin1 = cVar6.Begin._M_current;
  local_130 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&__begin1,1);
  local_120 = &local_130;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_120);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_120);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&__end1);
    std::operator<<(poStack_20," \"");
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_170._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe90);
      if (!bVar1) break;
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_171 = *pcVar5;
      if (local_171 == '\"') {
        std::operator<<(poStack_20,'\\');
      }
      std::operator<<(poStack_20,local_171);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(poStack_20,'\"');
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(poStack_20,")\n");
  if ((local_21 & 1) == 0) {
    local_19c = this_local._4_4_;
    poVar4 = ::operator<<(poStack_20,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar4 = std::operator<<(poVar4,"set_tests_properties(");
    cmTest::GetName_abi_cxx11_((string *)&__range1_1,this->Test);
    poVar4 = std::operator<<(poVar4,(string *)&__range1_1);
    std::operator<<(poVar4," PROPERTIES ");
    std::__cxx11::string::~string((string *)&__range1_1);
  }
  else {
    local_178 = this_local._4_4_;
    poVar4 = ::operator<<(poStack_20,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar4 = std::operator<<(poVar4,"set_tests_properties([");
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::operator<<(poVar4,"[");
    cmTest::GetName_abi_cxx11_(&local_198,this->Test);
    poVar4 = std::operator<<(poVar4,(string *)&local_198);
    poVar4 = std::operator<<(poVar4,"]");
    poVar4 = std::operator<<(poVar4,local_78);
    std::operator<<(poVar4,"] PROPERTIES ");
    std::__cxx11::string::~string((string *)&local_198);
  }
  this_00 = cmTest::GetProperties(this->Test);
  cmPropertyMap::GetList_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin1_1,this_00);
  __end1_1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__begin1_1);
  i = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__begin1_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&i);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&__end1_1);
    poVar4 = std::operator<<(poStack_20," ");
    poVar4 = std::operator<<(poVar4,(string *)local_1f8);
    poVar4 = std::operator<<(poVar4," ");
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f8->second);
    str._M_len = auVar7._8_8_;
    str._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_218,auVar7._0_8_,str,in_R8D);
    std::operator<<(poVar4,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__begin1_1);
  GenerateInternalProperties(this,poStack_20);
  std::operator<<(poStack_20,")\n");
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  if (quote_test_name) {
    fout << indent << "add_test([" << equalSigns << "["
         << this->Test->GetName() << "]" << equalSigns << "] \"" << exe
         << "\"";
  } else {
    fout << indent << "add_test(" << this->Test->GetName() << " \"" << exe
         << "\"";
  }

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << '"';
  }
  fout << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    fout << indent << "set_tests_properties([" << equalSigns << "["
         << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    fout << indent << "set_tests_properties(" << this->Test->GetName()
         << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second);
  }
  this->GenerateInternalProperties(fout);
  fout << ")\n";
}